

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O2

int run_test_udp_dual_stack(void)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  
  iVar2 = can_ipv6();
  if (iVar2 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    return 1;
  }
  do_test(ipv6_recv_ok,0);
  printf("recv_cb_called %d\n",(ulong)(uint)recv_cb_called);
  printf("send_cb_called %d\n",(ulong)(uint)send_cb_called);
  if (recv_cb_called == 1) {
    if (send_cb_called == 1) {
      return 0;
    }
    pcVar1 = "cl_send_cb_called == 1";
    uVar3 = 0xeb;
  }
  else {
    pcVar1 = "cl_recv_cb_called == 1";
    uVar3 = 0xea;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
          ,uVar3,pcVar1 + 3);
  abort();
}

Assistant:

TEST_IMPL(udp_dual_stack) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  /* FIXME: Does Cygwin support this?  */
  RETURN_SKIP("FIXME: This test needs more investigation on Cygwin");
#endif

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

#if defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || defined(__NetBSD__)
  if (!can_ipv6_ipv4_dual())
    RETURN_SKIP("IPv6-IPv4 dual stack not supported");
#elif defined(__OpenBSD__)
  RETURN_SKIP("IPv6-IPv4 dual stack not supported");
#endif

  do_test(ipv6_recv_ok, 0);

  printf("recv_cb_called %d\n", recv_cb_called);
  printf("send_cb_called %d\n", send_cb_called);
  ASSERT(recv_cb_called == 1);
  ASSERT(send_cb_called == 1);

  return 0;
}